

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_file_server.cpp
# Opt level: O0

void __thiscall cppcms::impl::file_server::load_mime_types(file_server *this,string *file_name)

{
  byte bVar1;
  bool bVar2;
  char *pcVar3;
  ulong uVar4;
  istream *piVar5;
  mapped_type *this_00;
  string ext;
  string mime;
  istringstream ss;
  string line;
  ifstream inp;
  undefined7 in_stack_fffffffffffffba8;
  undefined1 in_stack_fffffffffffffbaf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbb0;
  undefined6 in_stack_fffffffffffffbb8;
  undefined1 uVar6;
  string local_428 [32];
  string local_408 [32];
  string local_3e8 [32];
  istringstream local_3c8 [384];
  string local_248 [32];
  undefined4 local_228;
  long local_218 [67];
  
  pcVar3 = (char *)std::__cxx11::string::c_str();
  std::ifstream::ifstream(local_218,pcVar3,_S_in);
  bVar1 = std::ios::operator!((void *)((long)local_218 + *(long *)(local_218[0] + -0x18)));
  if ((bVar1 & 1) == 0) {
    std::__cxx11::string::string(local_248);
    while( true ) {
      bVar1 = std::ios::eof();
      uVar6 = false;
      if ((bVar1 & 1) == 0) {
        in_stack_fffffffffffffbb0 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_218,local_248);
        in_stack_fffffffffffffbaf =
             std::ios::operator_cast_to_bool
                       (&in_stack_fffffffffffffbb0->_M_dataplus +
                        *(long *)(*(long *)in_stack_fffffffffffffbb0 + -0x18));
        uVar6 = in_stack_fffffffffffffbaf;
      }
      if ((bool)uVar6 == false) break;
      uVar4 = std::__cxx11::string::empty();
      if (((uVar4 & 1) == 0) &&
         (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_248), *pcVar3 != '#')) {
        std::__cxx11::istringstream::istringstream(local_3c8,local_248,_S_in);
        std::__cxx11::string::string(local_3e8);
        std::__cxx11::string::string(local_408);
        piVar5 = std::operator>>((istream *)local_3c8,local_3e8);
        bVar2 = std::ios::operator_cast_to_bool(piVar5 + *(long *)(*(long *)piVar5 + -0x18));
        if (bVar2) {
          while( true ) {
            piVar5 = std::operator>>((istream *)local_3c8,local_408);
            bVar2 = std::ios::operator_cast_to_bool(piVar5 + *(long *)(*(long *)piVar5 + -0x18));
            if (!bVar2) break;
            std::operator+((char *)CONCAT17(bVar1,CONCAT16(uVar6,in_stack_fffffffffffffbb8)),
                           in_stack_fffffffffffffbb0);
            this_00 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    *)in_stack_fffffffffffffbb0,
                                   (key_type *)
                                   CONCAT17(in_stack_fffffffffffffbaf,in_stack_fffffffffffffba8));
            std::__cxx11::string::operator=((string *)this_00,local_3e8);
            std::__cxx11::string::~string(local_428);
          }
        }
        std::__cxx11::string::~string(local_408);
        std::__cxx11::string::~string(local_3e8);
        std::__cxx11::istringstream::~istringstream(local_3c8);
      }
    }
    std::__cxx11::string::~string(local_248);
    local_228 = 0;
  }
  else {
    local_228 = 1;
  }
  std::ifstream::~ifstream(local_218);
  return;
}

Assistant:

void file_server::load_mime_types(std::string file_name)
{
	booster::nowide::ifstream inp(file_name.c_str());
	if(!inp) {
		return;
	}
	std::string line;
	while(!inp.eof() && getline(inp,line)) {
		if(line.empty() || line[0]=='#')
			continue;
		std::istringstream ss(line);
		std::string mime;
		std::string ext;
		if(ss>>mime) {
			while(ss>>ext) {
				mime_["."+ext]=mime;
			}
		}
	}
}